

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_main_oj.cpp
# Opt level: O1

int main(void)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_03;
  Solution s;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  g;
  vector<int,_std::allocator<int>_> nums1;
  allocator_type local_cd;
  allocator_type local_cc;
  allocator_type local_cb;
  allocator_type local_ca;
  Solution local_c9;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  undefined1 local_98 [24];
  vector<int,_std::allocator<int>_> vStack_80;
  vector<int,_std::allocator<int>_> local_68;
  int local_48 [12];
  
  local_98._16_4_ = 1;
  stack0xffffffffffffff7c = 0x600000002;
  local_98._0_8_ = (pointer)0x300000001;
  local_98._8_4_ = 4;
  local_98._12_4_ = 7;
  __l._M_len = 7;
  __l._M_array = (iterator)local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__l,(allocator_type *)&local_c8);
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  __l_00._M_len = 4;
  __l_00._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_98,__l_00,&local_ca);
  local_48[8] = 0;
  local_48[9] = 1;
  local_48[10] = 2;
  local_48[0xb] = 0;
  __l_01._M_len = 4;
  __l_01._M_array = local_48 + 8;
  std::vector<int,_std::allocator<int>_>::vector(&vStack_80,__l_01,&local_cb);
  local_48[4] = 0;
  local_48[5] = 2;
  local_48[6] = 0;
  local_48[7] = 0;
  __l_02._M_len = 4;
  __l_02._M_array = local_48 + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__l_02,&local_cc);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_98;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_c8,__l_03,&local_cd);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)&local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_98 + lVar3 + -8) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  iVar2 = Solution::maximumMinutes(&local_c9,&local_c8);
  std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c8);
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    Solution s;
    vector<int> nums1 = {1,3,4,7,1,2,6};
//    vector<vector<int>> g = {{0,2,0,0,0,0,0},{0,0,0,2,2,1,0},{0,2,0,0,1,2,0},{0,0,2,2,2,0,2},{0,0,0,0,0,0,0}};
    vector<vector<int>> g = {{0,0,0,0},{0,1,2,0},{0,2,0,0}};
//    vector<vector<int>> g = {{0,0,0},{2,2,0},{1,2,0}};
    cout << (s.maximumMinutes(g));
    return 0;
}